

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::~cmMakefile(cmMakefile *this)

{
  cmMakefile *this_local;
  
  cmDeleteAll<std::vector<cmInstallGenerator*,std::allocator<cmInstallGenerator*>>>
            (&this->InstallGenerators);
  cmDeleteAll<std::vector<cmTestGenerator*,std::allocator<cmTestGenerator*>>>(&this->TestGenerators)
  ;
  cmDeleteAll<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>(&this->SourceFiles);
  cmDeleteAll<std::map<std::__cxx11::string,cmTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTest*>>>>
            (&this->Tests);
  cmDeleteAll<std::vector<cmTarget*,std::allocator<cmTarget*>>>(&this->ImportedTargetsOwned);
  cmDeleteAll<std::vector<cmCommand*,std::allocator<cmCommand*>>>(&this->FinalPassCommands);
  cmDeleteAll<std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>>
            (&this->FunctionBlockers);
  cmDeleteAll<std::vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>>
            (&this->EvaluationFiles);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector(&this->QtUiFilesWithOptions)
  ;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  ::~unordered_map(&this->OutputToSource);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::~unordered_map(&this->ImportedTargets);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::~vector(&this->ImportedTargetsOwned);
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::~vector
            (&this->ExecutionStatusStack);
  std::
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ::~vector(&this->EvaluationFiles);
  std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::~vector
            (&this->ExportBuildFileGenerators);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector(&this->UnConfiguredDirectories);
  cmsys::RegularExpression::~RegularExpression(&this->cmNamedCurly);
  cmsys::RegularExpression::~RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefineRegex);
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack(&this->LoopBlockCounter);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            (&this->FunctionBlockerBarriers);
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::~vector
            (&this->FunctionBlockers);
  cmListFileBacktrace::~cmListFileBacktrace(&this->Backtrace);
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::~vector(&this->FinalPassCommands);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&this->SourceGroups);
  std::__cxx11::string::~string((string *)&this->DefineFlagsOrig);
  std::__cxx11::string::~string((string *)&this->DefineFlags);
  std::__cxx11::string::~string((string *)&this->ComplainFileRegularExpression);
  std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::~vector(&this->TestGenerators)
  ;
  std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::~vector
            (&this->InstallGenerators);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OutputFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ListFiles);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->SystemIncludeDirectories);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
  ::~map(&this->Tests);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector(&this->SourceFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->AliasTargets);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
  ::~unordered_map(&this->Targets);
  std::set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>::
  ~set(&this->CMP0054ReportedIds);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->FindPackageModuleStack);
  return;
}

Assistant:

cmMakefile::~cmMakefile()
{
  cmDeleteAll(this->InstallGenerators);
  cmDeleteAll(this->TestGenerators);
  cmDeleteAll(this->SourceFiles);
  cmDeleteAll(this->Tests);
  cmDeleteAll(this->ImportedTargetsOwned);
  cmDeleteAll(this->FinalPassCommands);
  cmDeleteAll(this->FunctionBlockers);
  cmDeleteAll(this->EvaluationFiles);
}